

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O3

void __thiscall
ctemplate::Template::Template
          (Template *this,TemplateString *filename,Strip strip,TemplateCache *owner)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  
  this->_vptr_Template = (_func_int **)&PTR__Template_0014d1d8;
  pcVar1 = filename->ptr_;
  sVar2 = filename->length_;
  (this->original_filename_)._M_dataplus._M_p = (pointer)&(this->original_filename_).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->original_filename_,pcVar1,pcVar1 + sVar2);
  (this->resolved_filename_)._M_dataplus._M_p = (pointer)&(this->resolved_filename_).field_2;
  (this->resolved_filename_)._M_string_length = 0;
  (this->resolved_filename_).field_2._M_local_buf[0] = '\0';
  this->filename_mtime_ = 0;
  this->strip_ = strip;
  this->state_ = TS_EMPTY;
  this->template_cache_ = owner;
  this->template_text_ = (char *)0x0;
  this->template_text_len_ = 0;
  this->tree_ = (SectionTemplateNode *)0x0;
  (this->parse_state_).bufstart = (char *)0x0;
  *(undefined8 *)((long)&(this->parse_state_).bufstart + 4) = 0;
  *(undefined8 *)((long)&(this->parse_state_).bufend + 4) = 0;
  (this->parse_state_).current_delimiters.start_marker = "{{";
  (this->parse_state_).current_delimiters.start_marker_len = 2;
  (this->parse_state_).current_delimiters.end_marker = "}}";
  (this->parse_state_).current_delimiters.end_marker_len = 2;
  this->initial_context_ = TC_MANUAL;
  this->htmlparser_ = (HtmlParser *)0x0;
  pcVar1 = (this->original_filename_)._M_dataplus._M_p;
  sVar4 = strlen(pcVar1);
  if (3 < sVar4) {
    iVar3 = strcmp(pcVar1 + (sVar4 - 3),".js");
    if ((strip == STRIP_WHITESPACE) && (iVar3 == 0)) {
      this->strip_ = STRIP_BLANK_LINES;
    }
  }
  ReloadIfChangedLocked(this);
  return;
}

Assistant:

Template::Template(const TemplateString& filename, Strip strip,
                   TemplateCache* owner)
    // TODO(csilvers): replace ToString() with an is_immutable() check
    : original_filename_(filename.data(), filename.size()), resolved_filename_(),
      filename_mtime_(0), strip_(strip), state_(TS_EMPTY),
      template_cache_(owner), template_text_(NULL), template_text_len_(0),
      tree_(NULL), parse_state_(),
      initial_context_(TC_MANUAL), htmlparser_(NULL) {
  VLOG(2) << "Constructing Template for " << template_file()
          << "; with context " << initial_context_
          << "; and strip " << strip_ << endl;

  // Preserve whitespace in Javascript files because carriage returns
  // can convey meaning for comment termination and closures
  if (strsuffix(original_filename_.c_str(), ".js") &&
      strip_ == STRIP_WHITESPACE) {
    strip_ = STRIP_BLANK_LINES;
  }
  ReloadIfChangedLocked();
}